

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O0

bool __thiscall
libmatroska::KaxInternalBlock::AddFrame
          (KaxInternalBlock *this,KaxTrackEntry *track,uint64 timecode,DataBuffer *buffer,
          LacingType lacing,bool invisible)

{
  uint16 uVar1;
  int iVar2;
  size_type sVar3;
  EbmlUInteger *this_00;
  undefined4 extraout_var;
  DataBuffer *local_40;
  byte local_35;
  LacingType local_34;
  bool invisible_local;
  DataBuffer *pDStack_30;
  LacingType lacing_local;
  DataBuffer *buffer_local;
  uint64 timecode_local;
  KaxTrackEntry *track_local;
  KaxInternalBlock *this_local;
  
  local_35 = invisible;
  local_34 = lacing;
  pDStack_30 = buffer;
  buffer_local = (DataBuffer *)timecode;
  timecode_local = (uint64)track;
  track_local = (KaxTrackEntry *)this;
  libebml::EbmlElement::SetValueIsSet((EbmlElement *)this,true);
  sVar3 = std::vector<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>::size
                    (&this->myBuffers);
  if (sVar3 == 0) {
    this->Timecode = (uint64)buffer_local;
    this_00 = KaxTrackEntry::TrackNumber((KaxTrackEntry *)timecode_local);
    uVar1 = libebml::EbmlUInteger::operator_cast_to_unsigned_short(this_00);
    this->TrackNumber = uVar1;
    this->mInvisible = (bool)(local_35 & 1);
    this->mLacing = local_34;
  }
  local_40 = pDStack_30;
  std::vector<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>::push_back
            (&this->myBuffers,&local_40);
  sVar3 = std::vector<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>::size
                    (&this->myBuffers);
  if ((sVar3 < 8) && (local_34 != LACING_NONE)) {
    if (local_34 == LACING_XIPH) {
      iVar2 = (*pDStack_30->_vptr_DataBuffer[3])();
      this_local._7_1_ = *(uint *)CONCAT44(extraout_var,iVar2) < 0x5fa;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool KaxInternalBlock::AddFrame(const KaxTrackEntry & track, uint64 timecode, DataBuffer & buffer, LacingType lacing, bool invisible)
{
  SetValueIsSet();
  if (myBuffers.size() == 0) {
    // first frame
    Timecode = timecode;
    TrackNumber = track.TrackNumber();
    mInvisible = invisible;
    mLacing = lacing;
  }
  myBuffers.push_back(&buffer);

  // we don't allow more than 8 frames in a Block because the overhead improvement is minimal
  if (myBuffers.size() >= 8 || lacing == LACING_NONE)
    return false;

  if (lacing == LACING_XIPH)
    // decide wether a new frame can be added or not
    // a frame in a lace is not efficient when the place necessary to code it in a lace is bigger
    // than the size of a simple Block. That means more than 6 bytes (4 in struct + 2 for EBML) to code the size
    return (buffer.Size() < 6*0xFF);
  else
    return true;
}